

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::handleVariable
          (TParseContext *this,TSourceLoc *loc,TSymbol *symbol,TString *string)

{
  TLayoutGeometry TVar1;
  TIntermediate *pTVar2;
  TSymbolTable *this_00;
  char cVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar8;
  undefined4 extraout_var_04;
  long *plVar9;
  TVariable *this_01;
  TIntermSymbol *pTVar10;
  TIntermConstantUnion *index;
  undefined4 extraout_var_05;
  TTypeList *pTVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar12;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TType *__return_storage_ptr__;
  char *pcVar13;
  bool builtIn;
  TString *local_f8;
  TSymbol *symbol_local;
  TVector<const_glslang::TFunction_*> candidateList;
  TType local_c8;
  
  local_f8 = string;
  symbol_local = symbol;
  if (symbol == (TSymbol *)0x0) goto LAB_0040ba2c;
  iVar5 = (*symbol->_vptr_TSymbol[0x11])(symbol);
  if (iVar5 != 0) {
    uVar6 = (*symbol->_vptr_TSymbol[0x11])(symbol);
    iVar5 = (*symbol->_vptr_TSymbol[0x12])(symbol);
    (*symbol->_vptr_TSymbol[3])(symbol);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,(ulong)uVar6,CONCAT44(extraout_var,iVar5));
  }
  iVar5 = (*symbol->_vptr_TSymbol[0x14])(symbol);
  if ((char)iVar5 != '\0') {
    iVar5 = (*symbol->_vptr_TSymbol[0xc])(symbol);
    cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x180))
                      ((long *)CONCAT44(extraout_var_00,iVar5));
    if (cVar3 == '\0') {
      iVar5 = (*symbol->_vptr_TSymbol[0xc])(symbol);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x1a8))
                        ((long *)CONCAT44(extraout_var_01,iVar5));
      if (cVar3 == '\0') {
        iVar5 = (*symbol->_vptr_TSymbol[0xb])(symbol);
        if (CONCAT44(extraout_var_02,iVar5) != 0) {
          iVar5 = (*symbol->_vptr_TSymbol[0xb])(symbol);
          plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0xb0))
                                     ((long *)CONCAT44(extraout_var_03,iVar5));
          plVar8 = (long *)(**(code **)(*plVar8 + 0x60))(plVar8);
          cVar3 = (**(code **)(*plVar8 + 0x1a8))(plVar8);
          if (cVar3 != '\0') goto LAB_0040b7de;
        }
      }
      else {
LAB_0040b7de:
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4e])
                  (this,&symbol_local);
        symbol = symbol_local;
        if (symbol_local == (TSymbol *)0x0) goto LAB_0040ba2c;
      }
    }
  }
  iVar5 = (*symbol->_vptr_TSymbol[0xb])(symbol);
  plVar8 = (long *)CONCAT44(extraout_var_04,iVar5);
  if (plVar8 != (long *)0x0) {
    plVar9 = (long *)(**(code **)(*plVar8 + 0xb0))(plVar8);
    this_01 = (TVariable *)(**(code **)(*plVar9 + 0x50))(plVar9);
    pTVar10 = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,this_01,
                         loc);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    uVar6 = (**(code **)(*plVar8 + 0xb8))(plVar8);
    index = TIntermediate::addConstantUnion(pTVar2,uVar6,loc,false);
    pTVar10 = (TIntermSymbol *)
              TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         EOpIndexDirectStruct,&pTVar10->super_TIntermTyped,
                         &index->super_TIntermTyped,loc);
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    pTVar11 = TType::getStruct((TType *)CONCAT44(extraout_var_05,iVar5));
    uVar6 = (**(code **)(*plVar8 + 0xb8))(plVar8);
    (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar10,(pTVar11->
                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
                       .
                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6].type);
    iVar5 = (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar10);
    cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x18))
                      ((long *)CONCAT44(extraout_var_06,iVar5));
    if (cVar3 != '\0') {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"member of nameless block was not redeclared",(local_f8->_M_dataplus)._M_p
                 ,"");
    }
    goto LAB_0040bb93;
  }
  if (symbol_local == (TSymbol *)0x0) {
LAB_0040ba2c:
    builtIn = false;
    TVector<const_glslang::TFunction_*>::TVector(&candidateList);
    this_00 = (this->super_TParseContextBase).symbolTable;
    __return_storage_ptr__ = &local_c8;
    std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   __return_storage_ptr__,local_f8,"(");
    TSymbolTable::findFunctionNameList
              (this_00,(TString *)__return_storage_ptr__,&candidateList,&builtIn);
    if ((candidateList.
         super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         .
         super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         candidateList.
         super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         .
         super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) || (builtIn != false)) {
      this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)__return_storage_ptr__);
      TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      TVariable::TVariable(this_01,local_f8,&local_c8,false);
    }
    else {
      this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)__return_storage_ptr__);
      iVar5 = (*((*candidateList.
                   super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   .
                   super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol[3])();
      iVar7 = (*((*candidateList.
                   super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   .
                   super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol[6])();
      TType::TType(&local_c8,EbtFunction,EvqTemporary,1,0,0,false);
      TVariable::TVariable
                (this_01,(TString *)CONCAT44(extraout_var_12,iVar5),
                 (TString *)CONCAT44(extraout_var_13,iVar7),&local_c8,false);
    }
  }
  else {
    iVar5 = (*symbol_local->_vptr_TSymbol[9])();
    this_01 = (TVariable *)CONCAT44(extraout_var_07,iVar5);
    if (this_01 == (TVariable *)0x0) {
      if (symbol_local != (TSymbol *)0x0) {
        pcVar13 = "variable name expected";
        goto LAB_0040ba07;
      }
      goto LAB_0040ba2c;
    }
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x180))
                      ((long *)CONCAT44(extraout_var_08,iVar5));
    if (cVar3 != '\0') {
      this_01 = (TVariable *)0x0;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot be used (maybe an instance name is needed)",
                 (local_f8->_M_dataplus)._M_p);
    }
    if ((this_01 != (TVariable *)0x0) &&
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh)) {
      TVar1 = ((this->super_TParseContextBase).super_TParseVersions.intermediate)->outputPrimitive;
      iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[6])(this_01);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_09,iVar5),"gl_PrimitiveTriangleIndicesEXT");
      pcVar13 = "cannot be used (output primitive type mismatch)";
      if ((TVar1 == ElgTriangles) || (!bVar4)) {
        iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[6])(this_01);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_10,iVar5),"gl_PrimitiveLineIndicesEXT");
        if ((TVar1 == ElgLines) || (!bVar4)) {
          iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[6])(this_01);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)CONCAT44(extraout_var_11,iVar5),"gl_PrimitivePointIndicesEXT");
          if ((TVar1 == ElgPoints) || (!bVar4)) goto LAB_0040bb27;
        }
      }
LAB_0040ba07:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar13,(local_f8->_M_dataplus)._M_p);
      goto LAB_0040ba2c;
    }
    if (this_01 == (TVariable *)0x0) goto LAB_0040ba2c;
  }
LAB_0040bb27:
  iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar5) + 0x58))
                     ((long *)CONCAT44(extraout_var_14,iVar5));
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if ((*(ulong *)(lVar12 + 8) & 0x10000007f) == 2) {
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0x17])(this_01);
    iVar7 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    pTVar10 = (TIntermSymbol *)
              TIntermediate::addConstantUnion
                        (pTVar2,(TConstUnionArray *)CONCAT44(extraout_var_15,iVar5),
                         (TType *)CONCAT44(extraout_var_16,iVar7),loc,false);
  }
  else {
    pTVar10 = TIntermediate::addSymbol(pTVar2,this_01,loc);
  }
LAB_0040bb93:
  iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar5) + 0x58))
                     ((long *)CONCAT44(extraout_var_17,iVar5));
  if (((*(uint *)(lVar12 + 8) & 0x7f) < 0x1f) &&
     ((0x7ff00078U >> (*(uint *)(lVar12 + 8) & 0x1f) & 1) != 0)) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
    ::
    _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
              ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                *)&((this->super_TParseContextBase).super_TParseVersions.intermediate)->ioAccessed,
               local_f8);
  }
  iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
  iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar5) + 0x38))
                    ((long *)CONCAT44(extraout_var_18,iVar5));
  if (iVar5 == 0x12) {
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar5) + 0x58))
                       ((long *)CONCAT44(extraout_var_19,iVar5));
    if ((*(ushort *)(lVar12 + 0xe) & 0x2f2) != 0) {
      TIntermediate::setUseVulkanMemoryModel
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
  }
  return &pTVar10->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::handleVariable(const TSourceLoc& loc, TSymbol* symbol, const TString* string)
{
    TIntermTyped* node = nullptr;

    // Error check for requiring specific extensions present.
    if (symbol && symbol->getNumExtensions())
        requireExtensions(loc, symbol->getNumExtensions(), symbol->getExtensions(), symbol->getName().c_str());

    if (symbol && symbol->isReadOnly()) {
        // All shared things containing an unsized array must be copied up
        // on first use, so that all future references will share its array structure,
        // so that editing the implicit size will effect all nodes consuming it,
        // and so that editing the implicit size won't change the shared one.
        //
        // If this is a variable or a block, check it and all it contains, but if this
        // is a member of an anonymous block, check the whole block, as the whole block
        // will need to be copied up if it contains an unsized array.
        //
        // This check is being done before the block-name check further down, so guard
        // for that too.
        if (!symbol->getType().isUnusableName()) {
            if (symbol->getType().containsUnsizedArray() ||
                (symbol->getAsAnonMember() &&
                 symbol->getAsAnonMember()->getAnonContainer().getType().containsUnsizedArray()))
                makeEditable(symbol);
        }
    }

    const TVariable* variable;
    const TAnonMember* anon = symbol ? symbol->getAsAnonMember() : nullptr;
    if (anon) {
        // It was a member of an anonymous container.

        // Create a subtree for its dereference.
        variable = anon->getAnonContainer().getAsVariable();
        TIntermTyped* container = intermediate.addSymbol(*variable, loc);
        TIntermTyped* constNode = intermediate.addConstantUnion(anon->getMemberNumber(), loc);
        node = intermediate.addIndex(EOpIndexDirectStruct, container, constNode, loc);

        node->setType(*(*variable->getType().getStruct())[anon->getMemberNumber()].type);
        if (node->getType().hiddenMember())
            error(loc, "member of nameless block was not redeclared", string->c_str(), "");
    } else {
        // Not a member of an anonymous container.

        // The symbol table search was done in the lexical phase.
        // See if it was a variable.
        variable = symbol ? symbol->getAsVariable() : nullptr;
        if (variable) {
            if (variable->getType().isUnusableName()) {
                error(loc, "cannot be used (maybe an instance name is needed)", string->c_str(), "");
                variable = nullptr;
            }

            if (language == EShLangMesh && variable) {
                TLayoutGeometry primitiveType = intermediate.getOutputPrimitive();
                if ((variable->getMangledName() == "gl_PrimitiveTriangleIndicesEXT" && primitiveType != ElgTriangles) ||
                    (variable->getMangledName() == "gl_PrimitiveLineIndicesEXT" && primitiveType != ElgLines) ||
                    (variable->getMangledName() == "gl_PrimitivePointIndicesEXT" && primitiveType != ElgPoints)) {
                    error(loc, "cannot be used (output primitive type mismatch)", string->c_str(), "");
                    variable = nullptr;
                }
            }
        } else {
            if (symbol)
                error(loc, "variable name expected", string->c_str(), "");
        }

        // Recovery, if it wasn't found or was not a variable.
        if (! variable) {
            bool builtIn = false;
            TVector<const TFunction*> candidateList;
            symbolTable.findFunctionNameList(*string + "(", candidateList, builtIn);

            // If it's a function, pass the name/mangledName
            if (!candidateList.empty() && !builtIn) {
                variable = new TVariable(&candidateList[0]->getName(), &candidateList[0]->getMangledName(), TType(EbtFunction));
            } else {
                variable = new TVariable(string, TType(EbtVoid));
            }
        }

        if (variable->getType().getQualifier().isFrontEndConstant())
            node = intermediate.addConstantUnion(variable->getConstArray(), variable->getType(), loc);
        else
            node = intermediate.addSymbol(*variable, loc);
    }

    if (variable->getType().getQualifier().isIo())
        intermediate.addIoAccessed(*string);

    if (variable->getType().isReference() &&
        variable->getType().getQualifier().bufferReferenceNeedsVulkanMemoryModel()) {
        intermediate.setUseVulkanMemoryModel();
    }

    return node;
}